

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O0

void __thiscall
jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::destroy
          (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *this)

{
  json_storage_kind jVar1;
  long_string_storage *plVar2;
  byte_string_storage *pbVar3;
  array_storage *paVar4;
  object_storage *poVar5;
  pointer ptr;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *in_RDI;
  allocator_type alloc_1;
  object_storage *storage_1;
  allocator_type alloc;
  array_storage *storage;
  pointer_conflict in_stack_ffffffffffffff98;
  order_preserving_json_object<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::vector>
  *__p;
  allocator<jsoncons::json_array<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::vector>_>
  *in_stack_ffffffffffffffa0;
  allocator<jsoncons::order_preserving_json_object<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::vector>_>
  *this_00;
  undefined1 local_32 [2];
  object_storage *local_30;
  allocator<char> local_12 [2];
  array_storage *local_10;
  
  jVar1 = storage_kind(in_RDI);
  ptr = (pointer)(ulong)(byte)(jVar1 - byte_str);
  switch(ptr) {
  case (pointer)0x0:
    pbVar3 = basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
             cast<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::byte_string_storage>
                       ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
                         *)in_stack_ffffffffffffffa0);
    if (pbVar3->ptr_ != (pointer)0x0) {
      basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
      cast<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::byte_string_storage>
                ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
                 in_stack_ffffffffffffffa0);
      utility::heap_string_factory<unsigned_char,_unsigned_long,_std::allocator<char>_>::destroy
                (ptr);
    }
    break;
  case (pointer)0x1:
    poVar5 = basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
             cast<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::object_storage>
                       ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
                         *)in_stack_ffffffffffffffa0);
    if (poVar5->ptr_ != (pointer)0x0) {
      local_30 = basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
                 cast<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::object_storage>
                           ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
                             *)in_stack_ffffffffffffffa0);
      __p = (order_preserving_json_object<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::vector>
             *)local_32;
      allocator_holder<std::allocator<char>_>::get_allocator
                ((allocator_holder<std::allocator<char>_> *)__p);
      this_00 = (allocator<jsoncons::order_preserving_json_object<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::vector>_>
                 *)(local_32 + 1);
      std::
      allocator<jsoncons::order_preserving_json_object<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::vector>_>
      ::allocator<char>(this_00,(allocator<char> *)__p);
      std::allocator<char>::~allocator((allocator<char> *)__p);
      ext_traits::
      to_plain_pointer<jsoncons::order_preserving_json_object<std::__cxx11::string,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>,std::vector>>
                (local_30->ptr_);
      std::
      allocator_traits<std::allocator<jsoncons::order_preserving_json_object<std::__cxx11::string,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>,std::vector>>>
      ::
      destroy<jsoncons::order_preserving_json_object<std::__cxx11::string,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>,std::vector>>
                (this_00,__p);
      std::
      allocator_traits<std::allocator<jsoncons::order_preserving_json_object<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::vector>_>_>
      ::deallocate(this_00,__p,0x1f1c88);
      std::
      allocator<jsoncons::order_preserving_json_object<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::vector>_>
      ::~allocator((allocator<jsoncons::order_preserving_json_object<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::vector>_>
                    *)0x1f1c94);
    }
    break;
  case (pointer)0x2:
    paVar4 = basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
             cast<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::array_storage>
                       ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
                         *)in_stack_ffffffffffffffa0);
    if (paVar4->ptr_ != (pointer)0x0) {
      local_10 = basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
                 cast<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::array_storage>
                           ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
                             *)in_stack_ffffffffffffffa0);
      allocator_holder<std::allocator<char>_>::get_allocator
                (&in_stack_ffffffffffffff98->super_allocator_holder<std::allocator<char>_>);
      std::
      allocator<jsoncons::json_array<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::vector>_>
      ::allocator<char>(in_stack_ffffffffffffffa0,(allocator<char> *)in_stack_ffffffffffffff98);
      std::allocator<char>::~allocator(local_12);
      ext_traits::
      to_plain_pointer<jsoncons::json_array<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>,std::vector>>
                (local_10->ptr_);
      std::
      allocator_traits<std::allocator<jsoncons::json_array<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>,std::vector>>>
      ::
      destroy<jsoncons::json_array<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>,std::vector>>
                (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      std::
      allocator_traits<std::allocator<jsoncons::json_array<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::vector>_>_>
      ::deallocate(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,0x1f1bce);
      std::
      allocator<jsoncons::json_array<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::vector>_>
      ::~allocator((allocator<jsoncons::json_array<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::vector>_>
                    *)0x1f1bda);
    }
    break;
  case (pointer)0x3:
    plVar2 = basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
             cast<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::long_string_storage>
                       ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
                         *)in_stack_ffffffffffffffa0);
    if (plVar2->ptr_ != (pointer)0x0) {
      basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
      cast<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::long_string_storage>
                ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
                 in_stack_ffffffffffffffa0);
      utility::heap_string_factory<char,_jsoncons::null_type,_std::allocator<char>_>::destroy
                ((pointer)ptr);
    }
  }
  return;
}

Assistant:

void destroy()
        {
            switch (storage_kind())
            {
                case json_storage_kind::long_str:
                {
                    if (cast<long_string_storage>().ptr_ != nullptr)
                    {
                        long_string_storage::heap_string_factory_type::destroy(cast<long_string_storage>().ptr_);
                    }
                    break;
                }
                case json_storage_kind::byte_str:
                    if (cast<byte_string_storage>().ptr_ != nullptr)
                    {
                        byte_string_storage::heap_string_factory_type::destroy(cast<byte_string_storage>().ptr_);
                    }
                    break;
                case json_storage_kind::array:
                {
                    if (cast<array_storage>().ptr_ != nullptr)
                    {
                        auto& storage = cast<array_storage>();
                        typename array_storage::allocator_type alloc{storage.ptr_->get_allocator()};
                        std::allocator_traits<typename array_storage::allocator_type>::destroy(alloc, ext_traits::to_plain_pointer(storage.ptr_));
                        std::allocator_traits<typename array_storage::allocator_type>::deallocate(alloc, storage.ptr_,1);
                    }
                    break;
                }
                case json_storage_kind::object:
                {
                    if (cast<object_storage>().ptr_ != nullptr)
                    {
                        auto& storage = cast<object_storage>();
                        typename object_storage::allocator_type alloc{storage.ptr_->get_allocator()};
                        std::allocator_traits<typename object_storage::allocator_type>::destroy(alloc, ext_traits::to_plain_pointer(storage.ptr_));
                        std::allocator_traits<typename object_storage::allocator_type>::deallocate(alloc, storage.ptr_,1);
                    }
                    break;
                }
                default:
                    break;
            }
        }